

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.hpp
# Opt level: O0

void chip8::instructions::shl_reg_reg(registers *regs,instr_t instr)

{
  value_type vVar1;
  reference pvVar2;
  unsigned_long __n;
  reference pvVar3;
  unsigned_long x_offset;
  registers *regs_local;
  instr_t instr_local;
  
  regs_local._0_2_ = instr._M_elems;
  pvVar2 = std::array<std::byte,_2UL>::operator[]((array<std::byte,_2UL> *)&regs_local,0);
  __n = get_lower_nibble<unsigned_long>(*pvVar2);
  pvVar3 = std::array<std::byte,_16UL>::operator[](&regs->v,__n);
  regs_local._3_1_ = *pvVar3;
  regs_local._2_1_ = 0x80;
  vVar1 = regs_local._3_1_ & 0x80;
  pvVar3 = std::array<std::byte,_16UL>::operator[](&regs->v,0xf);
  *pvVar3 = vVar1 != 0;
  pvVar3 = std::array<std::byte,_16UL>::operator[](&regs->v,__n);
  *pvVar3 = *pvVar3 << 1;
  return;
}

Assistant:

constexpr void instructions::shl_reg_reg(chip8::registers& regs, instr_t instr) noexcept
	{
		const auto x_offset = instructions::get_lower_nibble<size_t>(instr[0]);
		regs.v[0xF] = (regs.v[x_offset] & std::byte{0x80}) != std::byte{0x00} ?
			std::byte{0x01} : std::byte{0x00};
		regs.v[x_offset] <<= 1;
	}